

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

wpt_object wpt_init(wave_object wave,int siglength,int J)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  wpt_object pwVar4;
  double dVar5;
  wpt_object obj;
  int local_38;
  int lp;
  int N;
  int p2;
  int elength;
  int nodes;
  int temp;
  int MaxIter;
  int i;
  int size;
  int J_local;
  int siglength_local;
  wave_object wave_local;
  
  iVar2 = wave->filtlength;
  if (100 < J) {
    printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
    exit(-1);
  }
  uVar3 = wmaxiter(siglength);
  if ((int)uVar3 < J) {
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",
           (ulong)uVar3);
    exit(-1);
  }
  elength = 1;
  p2 = 0;
  for (temp = 0; temp < J; temp = temp + 1) {
    elength = elength * 2;
    p2 = elength + p2;
  }
  lp = 2;
  N = 0;
  local_38 = siglength;
  for (temp = J; 0 < temp; temp = temp + -1) {
    dVar5 = ceil((double)(local_38 + iVar2 + -2) / 2.0);
    local_38 = (int)dVar5;
    N = lp * local_38;
    lp = lp << 1;
  }
  pwVar4 = (wpt_object)malloc((long)(N + p2 * 4 + J * 2 + 6) * 8 + 0x220);
  pwVar4->outlength = siglength + (J + 1) * 2 * (iVar2 + 1);
  strcpy(pwVar4->ext,"sym");
  strcpy(pwVar4->entropy,"shannon");
  pwVar4->eparam = 0.0;
  pwVar4->wave = wave;
  pwVar4->siglength = siglength;
  pwVar4->J = J;
  pwVar4->MaxIter = uVar3;
  if (siglength % 2 == 0) {
    pwVar4->even = 1;
  }
  else {
    pwVar4->even = 0;
  }
  pwVar4->cobj = (conv_object)0x0;
  pwVar4->nodes = p2;
  pwVar4->lenlength = J + 2;
  pwVar4->output = (double *)(pwVar4 + 1);
  pwVar4->costvalues = (double *)(pwVar4[1].ext + (long)N * 8 + -0x28);
  pwVar4->basisvector = (double *)(pwVar4[1].ext + (long)(N + p2 + 1) * 8 + -0x28);
  pwVar4->nodeindex = (int *)(pwVar4[1].ext + (long)(N + p2 * 2 + 2) * 8 + -0x28);
  pwVar4->numnodeslevel = (int *)(pwVar4[1].ext + (long)(N + p2 * 4 + 4) * 8 + -0x28);
  pwVar4->coeflength = (int *)(pwVar4[1].ext + (long)(N + p2 * 4 + J + 5) * 8 + -0x28);
  for (temp = 0; temp < N + p2 * 4 + J * 2 + 6; temp = temp + 1) {
    pcVar1 = pwVar4[1].ext + (long)temp * 8 + -0x28;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
  }
  return pwVar4;
}

Assistant:

wpt_object wpt_init(wave_object wave, int siglength, int J) {
	int size, i, MaxIter, temp, nodes,elength,p2,N,lp;
	wpt_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}


	MaxIter = wmaxiter(siglength);
	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n", MaxIter);
		exit(-1);
	}
	temp = 1;
	nodes = 0;
	for (i = 0; i < J; ++i) {
		temp *= 2;
		nodes += temp;
	}

	i = J;
	p2 = 2;
	N = siglength;
	lp = size;
	elength = 0;
	while (i > 0) {
		N = N + lp - 2;
		N = (int)ceil((double)N / 2.0);
		elength = p2 * N;
		i--;
		p2 *= 2;
	}
	//printf("elength %d", elength);

	obj = (wpt_object)malloc(sizeof(struct wpt_set) + sizeof(double)* (elength + 4 * nodes + 2 * J + 6));
	obj->outlength = siglength + 2 * (J + 1) * (size + 1);
	strcpy(obj->ext, "sym");
	strcpy(obj->entropy, "shannon");
	obj->eparam = 0.0;

	obj->wave = wave;
	obj->siglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;
	obj->nodes = nodes;

	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	obj->costvalues = &obj->params[elength];
	obj->basisvector = &obj->params[elength + nodes + 1];
	obj->nodeindex = (int*)&obj->params[elength + 2*nodes + 2];
	obj->numnodeslevel = (int*)&obj->params[elength + 4 * nodes + 4];
	obj->coeflength = (int*)&obj->params[elength + 4 * nodes + J + 5];

	for (i = 0; i < elength + 4 * nodes + 2 * J + 6; ++i) {
		obj->params[i] = 0.0;
	}

	//wave_summary(obj->wave);

	return obj;
}